

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O1

void dmrC_show_entry(dmr_C *C,entrypoint *ep)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 *puVar3;
  basic_block *bb;
  undefined1 local_68 [8];
  ptr_list_iter symiter__;
  ptr_list_iter puiter__;
  
  pcVar1 = dmrC_show_ident(C,ep->name->ident);
  printf("%s:\n",pcVar1);
  if (C->verbose != 0) {
    pcVar1 = dmrC_show_ident(C,ep->name->ident);
    printf("ep %p: %s\n",ep,pcVar1);
    ptrlist_forward_iterator((ptr_list_iter *)local_68,(ptr_list *)ep->syms);
    pvVar2 = ptrlist_iter_next((ptr_list_iter *)local_68);
    if (pvVar2 != (void *)0x0) {
      do {
        if ((*(long *)((long)pvVar2 + 0xd8) != 0) &&
           (*(long *)(*(long *)((long)pvVar2 + 0xd8) + 0x10) != 0)) {
          pcVar1 = dmrC_show_ident(C,*(ident **)((long)pvVar2 + 0x18));
          printf("   sym: %p %s\n",pvVar2,pcVar1);
          if ((*(uint *)((long)pvVar2 + 0x60) & 0x8000c) != 0) {
            puts("\texternal visibility");
          }
          if (*(long *)((long)pvVar2 + 0xd8) != 0) {
            ptrlist_forward_iterator
                      ((ptr_list_iter *)&symiter__.__nr,
                       *(ptr_list **)(*(long *)((long)pvVar2 + 0xd8) + 0x10));
            while( true ) {
              puVar3 = (undefined8 *)ptrlist_iter_next((ptr_list_iter *)&symiter__.__nr);
              if (puVar3 == (undefined8 *)0x0) break;
              pcVar1 = dmrC_show_instruction(C,(instruction *)*puVar3);
              printf("\t%s\n",pcVar1);
            }
          }
        }
        pvVar2 = ptrlist_iter_next((ptr_list_iter *)local_68);
      } while (pvVar2 != (void *)0x0);
    }
    putchar(10);
  }
  ptrlist_forward_iterator((ptr_list_iter *)&symiter__.__nr,(ptr_list *)ep->bbs);
  while( true ) {
    bb = (basic_block *)ptrlist_iter_next((ptr_list_iter *)&symiter__.__nr);
    if (bb == (basic_block *)0x0) break;
    if ((((bb->parents != (basic_block_list *)0x0) || (bb->children != (basic_block_list *)0x0)) ||
        (bb->insns != (instruction_list *)0x0)) || (1 < C->verbose)) {
      dmrC_show_bb(C,bb);
      putchar(10);
    }
  }
  putchar(10);
  return;
}

Assistant:

void dmrC_show_entry(struct dmr_C *C, struct entrypoint *ep)
{
	struct symbol *sym;
	struct basic_block *bb;

	printf("%s:\n", dmrC_show_ident(C, ep->name->ident));

	if (C->verbose) {
		printf("ep %p: %s\n", ep, dmrC_show_ident(C, ep->name->ident));

		FOR_EACH_PTR(ep->syms, sym) {
			if (!sym->pseudo)
				continue;
			if (!sym->pseudo->users)
				continue;
			printf("   sym: %p %s\n", sym, dmrC_show_ident(C, sym->ident));
			if (sym->ctype.modifiers & (MOD_EXTERN | MOD_STATIC | MOD_ADDRESSABLE))
				printf("\texternal visibility\n");
			show_symbol_usage(C, sym->pseudo);
		} END_FOR_EACH_PTR(sym);

		printf("\n");
	}

	FOR_EACH_PTR(ep->bbs, bb) {
		if (!bb)
			continue;
		if (!bb->parents && !bb->children && !bb->insns && C->verbose < 2)
			continue;
		dmrC_show_bb(C, bb);
		printf("\n");
	} END_FOR_EACH_PTR(bb);

	printf("\n");
}